

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall
LinearGE<1,_0>::LinearGE(LinearGE<1,_0> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  int *piVar1;
  uint i;
  ulong uVar2;
  undefined8 uStack_60;
  IntView<2> local_58;
  vec<IntView<3>_> *local_48;
  vec<Lit> *local_40;
  vec<int> *local_38;
  
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__LinearGE_001f2158;
  local_38 = &this->pos;
  vec<int>::vec(local_38,_x->sz);
  local_48 = &this->y;
  (this->y).sz = 0;
  (this->y).cap = 0;
  (this->y).data = (IntView<3> *)0x0;
  (this->x).sz = 0;
  (this->x).cap = 0;
  (this->x).data = (IntView<2> *)0x0;
  this->c = _c;
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  this->fix = 0;
  this->fix_x = 0;
  this->fix_y = 0;
  this->fix_sum = (long)-_c;
  local_40 = &this->ps;
  vec<Lit>::vec(local_40,_x->sz);
  (this->super_Propagator).priority = 2;
  for (uVar2 = 0; uVar2 < _x->sz; uVar2 = uVar2 + 1) {
    piVar1 = a->data;
    if (piVar1[uVar2] < 1) {
      (this->pos).data[uVar2] = ~(this->y).sz;
      local_58.var = _x->data[uVar2];
      local_58.a = -piVar1[uVar2];
      local_58.b = 0;
      vec<IntView<3>_>::push(local_48,(IntView<3> *)&local_58);
      uStack_60 = 2;
    }
    else {
      (this->pos).data[uVar2] = (this->x).sz;
      local_58.var = _x->data[uVar2];
      local_58.a = piVar1[uVar2];
      local_58.b = 0;
      vec<IntView<2>_>::push(&this->x,&local_58);
      uStack_60 = 4;
    }
    (*(_x->data[uVar2]->super_Var).super_Branching._vptr_Branching[7])
              (_x->data[uVar2],this,uVar2 & 0xffffffff,uStack_60);
  }
  return;
}

Assistant:

LinearGE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: pos(_x.size()),
				c(_c),
				r(std::move(_r)),

				fix_sum(-c),
				ps(R + _x.size()) {
		priority = 2;

		for (unsigned int i = 0; i < _x.size(); i++) {
			assert(a[i]);
			if (a[i] > 0) {
				pos[i] = x.size();
				x.push(IntView<2 * S>(_x[i], a[i]));
				_x[i]->attach(this, i, EVENT_U);
			} else {
				pos[i] = -static_cast<int>(y.size()) - 1;
				y.push(IntView<2 * S + 1>(_x[i], -a[i]));
				_x[i]->attach(this, i, EVENT_L);
			}
		}
		if (R != 0) {
			r.attach(this, _x.size(), EVENT_L);
		}
	}